

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O0

blip_time_t __thiscall Blip_Buffer::count_clocks(Blip_Buffer *this,long count)

{
  blip_resampled_time_t time;
  long count_local;
  Blip_Buffer *this_local;
  uint local_4;
  
  if (this->factor_ == 0) {
    local_4 = 0;
  }
  else {
    count_local = count;
    if (this->buffer_size_ < count) {
      count_local = (long)this->buffer_size_;
    }
    local_4 = ((((int)count_local * 0x10000 - this->offset_) + this->factor_) - 1) / this->factor_;
  }
  return local_4;
}

Assistant:

blip_time_t Blip_Buffer::count_clocks( long count ) const
{
	if ( !factor_ )
	{
		assert( 0 ); // sample rate and clock rates must be set first
		return 0;
	}
	
	if ( count > buffer_size_ )
		count = buffer_size_;
	blip_resampled_time_t time = (blip_resampled_time_t) count << BLIP_BUFFER_ACCURACY;
	return (blip_time_t) ((time - offset_ + factor_ - 1) / factor_);
}